

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O2

void Fraig_FeedBackCheckTable(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Fraig_Node_t *pFVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Fraig_NodeVec_t *p_00;
  Fraig_Node_t **ppFVar6;
  long lVar7;
  Fraig_Node_t *Entry;
  long lVar8;
  
  pFVar1 = p->pTableF;
  for (lVar4 = 0; lVar4 < pFVar1->nBins; lVar4 = lVar4 + 1) {
    ppFVar6 = pFVar1->pBins + lVar4;
    while (pFVar2 = *ppFVar6, pFVar2 != (Fraig_Node_t *)0x0) {
      p->vCones->nSize = 0;
      for (Entry = pFVar2; p_00 = p->vCones, Entry != (Fraig_Node_t *)0x0; Entry = Entry->pNextD) {
        Fraig_NodeVecPush(p_00,Entry);
      }
      iVar3 = p_00->nSize;
      if (iVar3 != 1) {
        lVar5 = 1;
        for (lVar8 = 0; lVar7 = lVar5, lVar8 < iVar3; lVar8 = lVar8 + 1) {
          for (; (int)lVar7 < iVar3; lVar7 = lVar7 + 1) {
            iVar3 = Fraig_CompareSimInfo(p_00->pArray[lVar8],p_00->pArray[lVar7],p->iWordStart,0);
            if (iVar3 != 0) {
              ppFVar6 = p->vCones->pArray;
              printf("Nodes %d and %d have the same D simulation info.\n",
                     (ulong)(uint)ppFVar6[lVar8]->Num,(ulong)(uint)ppFVar6[lVar7]->Num);
            }
            p_00 = p->vCones;
            iVar3 = p_00->nSize;
          }
          lVar5 = lVar5 + 1;
        }
      }
      ppFVar6 = &pFVar2->pNextF;
    }
  }
  return;
}

Assistant:

void Fraig_FeedBackCheckTable( Fraig_Man_t * p )
{
    Fraig_HashTable_t * pT = p->pTableF;
    Fraig_Node_t * pEntF, * pEntD;
    int i, k, m, nPairs;

    nPairs = 0;
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryD( pEntF, pEntD )
            Fraig_NodeVecPush( p->vCones, pEntD );
        if ( p->vCones->nSize == 1 )
            continue;
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( Fraig_CompareSimInfo( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0 ) )
                    printf( "Nodes %d and %d have the same D simulation info.\n", 
                        p->vCones->pArray[k]->Num, p->vCones->pArray[m]->Num );
                nPairs++;
            }   
    }
//    printf( "\nThe total of %d node pairs have been verified.\n", nPairs );
}